

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::internal::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void> *this,Arg *arg)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint *puVar5;
  
  switch(arg->type) {
  case INT:
  case UINT:
  case CHAR:
    bVar3 = *(byte *)&(arg->super_Value).field_0;
    uVar4 = (uint)bVar3;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      puVar5 = *(uint **)this;
      puVar5[4] = 2;
      uVar4 = (uint)(char)bVar3;
    }
    else {
      puVar5 = *(uint **)this;
      puVar5[4] = 3;
    }
    break;
  case LONG_LONG:
  case ULONG_LONG:
    bVar3 = (byte)(arg->super_Value).field_0.long_long_value;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      puVar5 = *(uint **)this;
      puVar5[4] = 2;
      uVar4 = (uint)(char)bVar3;
    }
    else {
      puVar5 = *(uint **)this;
      puVar5[4] = 3;
      uVar4 = (uint)bVar3;
    }
    break;
  case BOOL:
    iVar1 = (arg->super_Value).field_0.int_value;
    iVar2 = *(int *)(this + 8);
    if (iVar2 != 100) {
      if (iVar2 == 0x73) {
        return;
      }
      if (iVar2 != 0x69) {
        puVar5 = *(uint **)this;
        puVar5[4] = 3;
        goto LAB_001c06ac;
      }
    }
    puVar5 = *(uint **)this;
    puVar5[4] = 2;
LAB_001c06ac:
    *puVar5 = (uint)(iVar1 != 0);
    return;
  case DOUBLE:
  case LAST_NUMERIC_TYPE:
  case CSTRING:
  case STRING:
  case WSTRING:
  case POINTER:
  case CUSTOM:
    return;
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::(anonymous namespace)::ArgConverter<signed char>, void>::visit(const Arg &) [Impl = fmt::(anonymous namespace)::ArgConverter<signed char>, Result = void]"
                 );
  }
  *puVar5 = uVar4;
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }